

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_generic_section.hpp
# Opt level: O1

error_or<pstore::repo::section_content_*> * __thiscall
pstore::exchange::import_ns::
generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::content_object(error_or<pstore::repo::section_content_*> *__return_storage_ptr__,
                generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                *this)

{
  section_content *psVar1;
  pstore *this_00;
  ulong uVar2;
  error_code *peVar3;
  section_content **ppsVar4;
  error e;
  back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> in_R8;
  error_code eVar5;
  maybe<std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>,_void> local_28;
  
  uVar2 = (this->seen_).super__Base_bitset<1UL>._M_w | 0xd;
  (this->seen_).super__Base_bitset<1UL>._M_w = uVar2;
  if (uVar2 == 0xf) {
    uVar2 = this->align_;
    if ((int)POPCOUNT(uVar2) == 1) {
      if (uVar2 < 0x100) {
        psVar1 = (this->content_).ptr_;
        psVar1->kind = this->kind_;
        psVar1->align = (uint8_t)uVar2;
        this_00 = (pstore *)(this->data_)._M_dataplus._M_p;
        from_base64<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>>
                  (&local_28,this_00,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(this_00 + (this->data_)._M_string_length),
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )&psVar1->data,in_R8);
        if (local_28.valid_ == true) {
          __return_storage_ptr__->has_error_ = false;
          ppsVar4 = error_or<pstore::repo::section_content*>::
                    value_storage_impl<pstore::error_or<pstore::repo::section_content*>&,pstore::repo::section_content*>
                              (__return_storage_ptr__);
          *ppsVar4 = (this->content_).ptr_;
          return __return_storage_ptr__;
        }
        __return_storage_ptr__->has_error_ = true;
        peVar3 = error_or<pstore::repo::section_content*>::
                 error_storage_impl<pstore::error_or<pstore::repo::section_content*>&,std::error_code>
                           (__return_storage_ptr__);
        e = bad_base64_data;
      }
      else {
        __return_storage_ptr__->has_error_ = true;
        peVar3 = error_or<pstore::repo::section_content*>::
                 error_storage_impl<pstore::error_or<pstore::repo::section_content*>&,std::error_code>
                           (__return_storage_ptr__);
        e = alignment_is_too_great;
      }
    }
    else {
      __return_storage_ptr__->has_error_ = true;
      peVar3 = error_or<pstore::repo::section_content*>::
               error_storage_impl<pstore::error_or<pstore::repo::section_content*>&,std::error_code>
                         (__return_storage_ptr__);
      e = alignment_must_be_power_of_2;
    }
  }
  else {
    __return_storage_ptr__->has_error_ = true;
    peVar3 = error_or<pstore::repo::section_content*>::
             error_storage_impl<pstore::error_or<pstore::repo::section_content*>&,std::error_code>
                       (__return_storage_ptr__);
    e = generic_section_was_incomplete;
  }
  eVar5 = make_error_code(e);
  peVar3->_M_value = eVar5._M_value;
  peVar3->_M_cat = eVar5._M_cat;
  return __return_storage_ptr__;
}

Assistant:

error_or<repo::section_content *> generic_section<OutputIterator>::content_object () {
                using return_type = error_or<repo::section_content *>;

                // The alignment field may be omitted if it is 1.
                seen_[align] = true;
                // We allow either or both of the internal and external fixup keys to be omitted if
                // their respective contents are empty.
                seen_[ifixups] = true;
                seen_[xfixups] = true;

                // Issue an error is any of the required fields were missing.
                if (!seen_.all ()) {
                    return return_type{error::generic_section_was_incomplete};
                }
                if (!is_power_of_two (align_)) {
                    return return_type{error::alignment_must_be_power_of_2};
                }
                using align_type = decltype (content_->align);
                static_assert (std::is_unsigned<align_type>::value,
                               "Expected alignment to be unsigned");
                if (align_ > std::numeric_limits<align_type>::max ()) {
                    return return_type{error::alignment_is_too_great};
                }
                content_->kind = kind_;
                content_->align = static_cast<align_type> (align_);
                if (!from_base64 (std::begin (data_), std::end (data_),
                                  std::back_inserter (content_->data))) {
                    return return_type{error::bad_base64_data};
                }
                return return_type{content_};
            }